

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeProg * __thiscall Parser::CreateProgNode(Parser *this,bool isModuleSource,ULONG lineNumber)

{
  Scanner_t *this_00;
  size_t sVar1;
  ParseNodeType *local_20;
  ParseNodeProg *pnodeProg;
  ULONG lineNumber_local;
  bool isModuleSource_local;
  Parser *this_local;
  
  if (isModuleSource) {
    local_20 = CreateNodeForOpT<(OpCode)88>(this);
    (local_20->super_ParseNodeProg).super_ParseNodeFnc.super_ParseNode.nop = knopProg;
  }
  else {
    local_20 = (ParseNodeType *)CreateNodeForOpT<(OpCode)87>(this);
  }
  this_00 = GetScanner(this);
  sVar1 = Scanner<UTF8EncodingPolicyBase<false>_>::IecpMinTok(this_00);
  (local_20->super_ParseNodeProg).super_ParseNodeFnc.cbMin = sVar1;
  (local_20->super_ParseNodeProg).super_ParseNodeFnc.cbStringMin =
       (local_20->super_ParseNodeProg).super_ParseNodeFnc.cbMin;
  (local_20->super_ParseNodeProg).super_ParseNodeFnc.cbStringLim =
       (local_20->super_ParseNodeProg).super_ParseNodeFnc.cbLim;
  (local_20->super_ParseNodeProg).super_ParseNodeFnc.lineNumber = lineNumber;
  (local_20->super_ParseNodeProg).super_ParseNodeFnc.homeObjLocation = 0xffffffff;
  (local_20->super_ParseNodeProg).super_ParseNodeFnc.superRestrictionState = Disallowed;
  return &local_20->super_ParseNodeProg;
}

Assistant:

ParseNodeProg * Parser::CreateProgNode(bool isModuleSource, ULONG lineNumber)
{
    ParseNodeProg * pnodeProg;

    if (isModuleSource)
    {
        pnodeProg = CreateNodeForOpT<knopModule>();

        // knopModule is not actually handled anywhere since we would need to handle it everywhere we could
        // have knopProg and it would be treated exactly the same except for import/export statements.
        // We are only using it as a way to get the correct size for PnModule.
        // Consider: Should we add a flag to PnProg which is false but set to true in PnModule?
        //           If we do, it can't be a virtual method since the parse nodes are all in a union.
        pnodeProg->nop = knopProg;
    }
    else
    {
        pnodeProg = CreateNodeForOpT<knopProg>();
    }

    pnodeProg->cbMin = this->GetScanner()->IecpMinTok();
    pnodeProg->cbStringMin = pnodeProg->cbMin;
    pnodeProg->cbStringLim = pnodeProg->cbLim;
    pnodeProg->lineNumber = lineNumber;
    pnodeProg->homeObjLocation = Js::Constants::NoRegister;
    pnodeProg->superRestrictionState = SuperRestrictionState::Disallowed;
    return pnodeProg;
}